

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.cxx
# Opt level: O2

int main(void)

{
  long lVar1;
  undefined4 *puVar2;
  OledI2C *pOVar3;
  int x;
  ulong uVar4;
  int y;
  uint uVar5;
  initializer_list<int> list;
  allocator local_4f1;
  string local_4f0;
  OledBitmap<16,_16> bitmap;
  OledI2C oled;
  
  puVar2 = &DAT_00106004;
  pOVar3 = &oled;
  for (lVar1 = 0x20; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined4 *)&(pOVar3->super_OledHardware)._vptr_OledHardware = *puVar2;
    puVar2 = puVar2 + 1;
    pOVar3 = (OledI2C *)((long)&(pOVar3->super_OledHardware)._vptr_OledHardware + 4);
  }
  list._M_len = 0x20;
  list._M_array = (iterator)&oled;
  SSD1306::OledBitmap<16,_16>::OledBitmap(&bitmap,list);
  std::__cxx11::string::string((string *)&local_4f0,"/dev/i2c-1",&local_4f1);
  SSD1306::OledI2C::OledI2C(&oled,&local_4f0,'<');
  std::__cxx11::string::~string((string *)&local_4f0);
  for (uVar5 = 0xfffffff8; (int)uVar5 < 0x48; uVar5 = uVar5 + 0x10) {
    for (uVar4 = 0xfffffff8; (int)uVar4 < 0x88; uVar4 = (ulong)((int)uVar4 + 0x10)) {
      SSD1306::OledPixel::setFrom
                (&oled.super_OledPixel,&bitmap.super_OledPixel,
                 (OledPoint)(uVar4 | (ulong)uVar5 << 0x20));
    }
  }
  SSD1306::OledI2C::displayUpdate(&oled);
  SSD1306::OledI2C::~OledI2C(&oled);
  SSD1306::OledPixel::~OledPixel(&bitmap.super_OledPixel);
  return 0;
}

Assistant:

int
main()
{
    try
    {
        SSD1306::OledBitmap<16, 16> bitmap
        {
             0b00001010, 0b10100000,
             0b00001111, 0b11000000,
             0b00111111, 0b11101000,
             0b00111111, 0b01010000,
             0b01111111, 0b11101010,
             0b01111111, 0b11010100,
             0b11111111, 0b10101010,
             0b01110111, 0b01010000,
             0b11111111, 0b11101010,
             0b01010101, 0b01000000,
             0b00111010, 0b10100010,
             0b00010101, 0b00000000,
             0b00101010, 0b10101000,
             0b00000100, 0b00000000,
             0b00000010, 0b00100000,
             0b00000000, 0b00000000
        };

        SSD1306::OledI2C oled{"/dev/i2c-1", 0x3C};

        for (auto y = -(bitmap.height() / 2) ;
             y < (oled.height() + (bitmap.height() / 2)) ;
             y += bitmap.height())
        {
            for (auto x = -(bitmap.width() / 2) ;
                 x < (oled.width() + (bitmap.width() / 2)) ;
                 x += bitmap.width())
            {
                oled.setFrom(bitmap, SSD1306::OledPoint{x, y});
            }
        }

        oled.displayUpdate();
    }
    catch (std::exception& e)
    {
        std::cerr << e.what() << "\n";
    }

    return 0;
}